

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityDamageStatusPdu.cpp
# Opt level: O2

int __thiscall DIS::EntityDamageStatusPdu::getMarshalledSize(EntityDamageStatusPdu *this)

{
  pointer pDVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  DirectedEnergyDamage listElement;
  
  iVar2 = WarfareFamilyPdu::getMarshalledSize(&this->super_WarfareFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_damagedEntityID);
  iVar2 = iVar2 + iVar3 + 6;
  lVar4 = 0x58;
  uVar5 = 0;
  while( true ) {
    pDVar1 = (this->_damageDescriptionRecords).
             super__Vector_base<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_damageDescriptionRecords).
                       super__Vector_base<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0x60) <= uVar5)
    break;
    listElement._vptr_DirectedEnergyDamage = (_func_int **)&PTR__DirectedEnergyDamage_001c1158;
    listElement._8_8_ = *(undefined8 *)((long)pDVar1 + lVar4 + -0x50);
    listElement._damageLocation._vptr_Vector3Float = (_func_int **)&PTR__Vector3Float_001c3790;
    listElement._damageLocation._z = *(float *)((long)pDVar1 + lVar4 + -0x38);
    listElement._damageLocation._8_8_ = *(undefined8 *)((long)pDVar1 + lVar4 + -0x40);
    listElement._48_4_ = *(undefined4 *)((long)pDVar1 + lVar4 + -0x28);
    listElement._40_8_ = *(undefined8 *)((long)pDVar1 + lVar4 + -0x30);
    listElement._fireEventID._vptr_EventIdentifier = (_func_int **)&PTR__EventIdentifier_001c1930;
    listElement._fireEventID._simulationAddress._vptr_SimulationAddress =
         (_func_int **)&PTR__SimulationAddress_001c2fb8;
    listElement._fireEventID._simulationAddress._8_4_ =
         *(undefined4 *)((long)pDVar1 + lVar4 + -0x10);
    listElement._fireEventID._eventNumber = *(unsigned_short *)((long)pDVar1 + lVar4 + -8);
    listElement._padding2 = *(unsigned_short *)((long)&pDVar1->_vptr_DirectedEnergyDamage + lVar4);
    iVar3 = DirectedEnergyDamage::getMarshalledSize(&listElement);
    iVar2 = iVar2 + iVar3;
    DirectedEnergyDamage::~DirectedEnergyDamage(&listElement);
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x60;
  }
  return iVar2;
}

Assistant:

int EntityDamageStatusPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = WarfareFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _damagedEntityID.getMarshalledSize();  // _damagedEntityID
   marshalSize = marshalSize + 2;  // _padding1
   marshalSize = marshalSize + 2;  // _padding2
   marshalSize = marshalSize + 2;  // _numberOfDamageDescription

   for(unsigned long long idx=0; idx < _damageDescriptionRecords.size(); idx++)
   {
        DirectedEnergyDamage listElement = _damageDescriptionRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}